

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O3

bool __thiscall trieste::wf::Sequence::check(Sequence *this,Node *node)

{
  pointer psVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  pointer psVar5;
  bool bVar6;
  unsigned_long local_228;
  Node local_220;
  Node *local_210;
  string local_208;
  string local_1e8;
  Log local_1c8;
  
  peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar5 = (peVar4->children).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (peVar4->children).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    bVar6 = false;
    local_210 = node;
    do {
      local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar2 = !bVar6;
      bVar6 = true;
      if (bVar2) {
        bVar6 = ((local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->type_).def == (TokenDef *)Error;
      }
      local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar2 = Choice::check(&this->choice,&local_220);
      if (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_220.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar3 = (bool)(bVar3 & bVar2);
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
    node = local_210;
    if (bVar6) {
      return bVar3;
    }
  }
  peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((ulong)((long)(peVar4->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(peVar4->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < this->minlen) {
    local_1c8.print = Silent;
    if (1 < logging::detail::report_level) {
      logging::Log::start(&local_1c8,Error);
      peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    Location::origin_linecol_abi_cxx11_(&local_1e8,&peVar4->location_);
    if ((((local_1c8.print == Silent) ||
         (logging::append<std::__cxx11::string>(&local_1c8,&local_1e8), local_1c8.print == Silent))
        || (logging::append<char[21]>(&local_1c8,(char (*) [21])": expected at least "),
           local_1c8.print == Silent)) ||
       (logging::append<unsigned_long>(&local_1c8,&this->minlen), local_1c8.print == Silent)) {
      peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228 = (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
    }
    else {
      logging::append<char[18]>(&local_1c8,(char (*) [18])0x25e65a);
      peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228 = (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
      if ((local_1c8.print != Silent) &&
         (logging::append<unsigned_long>(&local_1c8,&local_228), local_1c8.print != Silent)) {
        logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
      }
    }
    Location::str_abi_cxx11_
              (&local_208,
               &((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                location_);
    if (((local_1c8.print != Silent) &&
        (logging::append<std::__cxx11::string>(&local_1c8,&local_208), local_1c8.print != Silent))
       && (logging::append<std::shared_ptr<trieste::NodeDef>>(&local_1c8,node),
          local_1c8.print != Silent)) {
      logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8.print != Silent) {
      logging::Log::end(&local_1c8);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool check(Node node) const
      {
        auto has_err = false;
        auto ok = true;

        for (auto& child : *node)
        {
          has_err = has_err || (child == Error);
          ok = choice.check(child) && ok;
        }

        if (!has_err && (node->size() < minlen))
        {
          logging::Error() << node->location().origin_linecol()
                           << ": expected at least " << minlen
                           << " children, found " << node->size() << std::endl
                           << node->location().str() << node << std::endl;
          ok = false;
        }

        return ok;
      }